

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeBlock
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Block *curr;
  
  curr = MixedArena::alloc<wasm::Block>(&this->wasm->allocator);
  (curr->name).super_IString.str._M_len = label.super_IString.str._M_len;
  (curr->name).super_IString.str._M_str = label.super_IString.str._M_str;
  (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
       sig.results.id.id;
  visitBlockStart(__return_storage_ptr__,this,curr,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeBlock(Name label, Signature sig) {
  auto* block = wasm.allocator.alloc<Block>();
  block->name = label;
  block->type = sig.results;
  return visitBlockStart(block, sig.params);
}